

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData * cfd::core::HashUtil::Sha512(ByteData *__return_storage_ptr__,ByteData *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  ByteData *local_18;
  ByteData *data_local;
  
  local_18 = data;
  data_local = __return_storage_ptr__;
  ByteData::GetBytes(&local_30,data);
  Sha512(__return_storage_ptr__,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData HashUtil::Sha512(const ByteData &data) {
  return Sha512(data.GetBytes());
}